

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O0

void __thiscall
testing::internal::GoogleTestFailureReporter::ReportFailure
          (GoogleTestFailureReporter *this,FailureType type,char *file,int line,string *message)

{
  int line_00;
  char *file_00;
  char *message_00;
  bool bVar1;
  AssertHelper local_40;
  Message local_38;
  string *local_30;
  string *message_local;
  char *pcStack_20;
  int line_local;
  char *file_local;
  GoogleTestFailureReporter *pGStack_10;
  FailureType type_local;
  GoogleTestFailureReporter *this_local;
  
  local_30 = message;
  message_local._4_4_ = line;
  pcStack_20 = file;
  file_local._4_4_ = type;
  pGStack_10 = this;
  Message::Message(&local_38);
  file_00 = pcStack_20;
  line_00 = message_local._4_4_;
  bVar1 = file_local._4_4_ == kFatal;
  message_00 = (char *)std::__cxx11::string::c_str();
  AssertHelper::AssertHelper(&local_40,bVar1 + kNonFatalFailure,file_00,line_00,message_00);
  AssertHelper::operator=(&local_40,&local_38);
  AssertHelper::~AssertHelper(&local_40);
  Message::~Message(&local_38);
  if (file_local._4_4_ == kFatal) {
    posix::Abort();
  }
  return;
}

Assistant:

void ReportFailure(FailureType type, const char* file, int line,
                     const std::string& message) override {
    AssertHelper(type == kFatal ?
                 TestPartResult::kFatalFailure :
                 TestPartResult::kNonFatalFailure,
                 file,
                 line,
                 message.c_str()) = Message();
    if (type == kFatal) {
      posix::Abort();
    }
  }